

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VtabSavepoint(sqlite3 *db,int op,int iSavepoint)

{
  VTable *pVVar1;
  sqlite3_module *psVar2;
  int iVar3;
  _func_int_sqlite3_vtab_ptr_int *p_Var4;
  int i;
  long lVar5;
  
  if (db->aVTrans == (VTable **)0x0) {
    return 0;
  }
  lVar5 = 0;
  iVar3 = 0;
  while( true ) {
    if (iVar3 != 0) {
      return iVar3;
    }
    if (db->nVTrans <= lVar5) break;
    pVVar1 = db->aVTrans[lVar5];
    iVar3 = 0;
    if ((pVVar1->pVtab != (sqlite3_vtab *)0x0) &&
       (psVar2 = pVVar1->pMod->pModule, 1 < psVar2->iVersion)) {
      if (op == 2) {
        p_Var4 = psVar2->xRollbackTo;
      }
      else if (op == 0) {
        p_Var4 = psVar2->xSavepoint;
        pVVar1->iSavepoint = iSavepoint + 1;
      }
      else {
        p_Var4 = psVar2->xRelease;
      }
      if ((p_Var4 != (_func_int_sqlite3_vtab_ptr_int *)0x0) &&
         (iVar3 = 0, iSavepoint < pVVar1->iSavepoint)) {
        iVar3 = (*p_Var4)(pVVar1->pVtab,iSavepoint);
      }
    }
    lVar5 = lVar5 + 1;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VtabSavepoint(sqlite3 *db, int op, int iSavepoint){
  int rc = SQLITE_OK;

  assert( op==SAVEPOINT_RELEASE||op==SAVEPOINT_ROLLBACK||op==SAVEPOINT_BEGIN );
  assert( iSavepoint>=0 );
  if( db->aVTrans ){
    int i;
    for(i=0; rc==SQLITE_OK && i<db->nVTrans; i++){
      VTable *pVTab = db->aVTrans[i];
      const sqlite3_module *pMod = pVTab->pMod->pModule;
      if( pVTab->pVtab && pMod->iVersion>=2 ){
        int (*xMethod)(sqlite3_vtab *, int);
        switch( op ){
          case SAVEPOINT_BEGIN:
            xMethod = pMod->xSavepoint;
            pVTab->iSavepoint = iSavepoint+1;
            break;
          case SAVEPOINT_ROLLBACK:
            xMethod = pMod->xRollbackTo;
            break;
          default:
            xMethod = pMod->xRelease;
            break;
        }
        if( xMethod && pVTab->iSavepoint>iSavepoint ){
          rc = xMethod(pVTab->pVtab, iSavepoint);
        }
      }
    }
  }
  return rc;
}